

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

int32_t __thiscall icu_63::MessagePattern::skipDouble(MessagePattern *this,int32_t index)

{
  short sVar1;
  char16_t cVar2;
  int iVar3;
  
  sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (this->msg).fUnion.fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  do {
    if (iVar3 <= index) {
      return index;
    }
    cVar2 = UnicodeString::doCharAt(&this->msg,index);
    if ((ushort)cVar2 < 0x30) {
      if (0x2e < (ushort)cVar2) {
        return index;
      }
      if ((0x680000000000U >> ((ulong)(ushort)cVar2 & 0x3f) & 1) == 0) {
        return index;
      }
    }
    else if ((((0x39 < (ushort)cVar2) && (cVar2 != L'E')) && (cVar2 != L'∞')) && (cVar2 != L'e'))
    {
      return index;
    }
    index = index + 1;
  } while( true );
}

Assistant:

int32_t
MessagePattern::skipDouble(int32_t index) {
    int32_t msgLength=msg.length();
    while(index<msgLength) {
        UChar c=msg.charAt(index);
        // U+221E: Allow the infinity symbol, for ChoiceFormat patterns.
        if((c<0x30 && c!=u_plus && c!=u_minus && c!=u_dot) || (c>0x39 && c!=u_e && c!=u_E && c!=0x221e)) {
            break;
        }
        ++index;
    }
    return index;
}